

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_MissingSSTFile::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_MissingSSTFile t;
  
  _Test_MissingSSTFile((_Test_MissingSSTFile *)local_a8);
  _Run((_Test_MissingSSTFile *)local_a8);
  ~_Test_MissingSSTFile((_Test_MissingSSTFile *)local_a8);
  return;
}

Assistant:

TEST(DBTest, MissingSSTFile) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ("bar", Get("foo"));

  // Dump the memtable to disk.
  dbfull()->TEST_CompactMemTable();
  ASSERT_EQ("bar", Get("foo"));

  Close();
  ASSERT_TRUE(DeleteAnSSTFile());
  Options options = CurrentOptions();
  options.paranoid_checks = true;
  Status s = TryReopen(&options);
  ASSERT_TRUE(!s.ok());
  ASSERT_TRUE(s.ToString().find("issing") != std::string::npos) << s.ToString();
}